

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkLayerValidator.cpp
# Opt level: O3

Result * __thiscall
CoreML::NeuralNetworkSpecValidator::validateLoopContinueBreakLayer
          (Result *__return_storage_ptr__,NeuralNetworkSpecValidator *this,NeuralNetworkLayer *layer
          )

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  long lVar4;
  bool bVar5;
  long *plVar6;
  undefined8 *puVar7;
  long *plVar8;
  Result *_result;
  string err;
  long *local_b0;
  long local_a8;
  long local_a0;
  long lStack_98;
  string local_90;
  long *local_70 [2];
  long local_60 [2];
  long *local_50;
  long local_48;
  long local_40;
  long lStack_38;
  
  validateInputCount(__return_storage_ptr__,layer,0,0);
  bVar5 = Result::good(__return_storage_ptr__);
  if (bVar5) {
    pcVar3 = (__return_storage_ptr__->m_message)._M_dataplus._M_p;
    paVar1 = &(__return_storage_ptr__->m_message).field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar3 != paVar1) {
      operator_delete(pcVar3,paVar1->_M_allocated_capacity + 1);
    }
    paVar2 = &local_90.field_2;
    local_90._M_string_length = 0;
    local_90.field_2._M_local_buf[0] = '\0';
    local_90._M_dataplus._M_p = (pointer)paVar2;
    Result::Result(__return_storage_ptr__);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != paVar2) {
      operator_delete(local_90._M_dataplus._M_p,
                      CONCAT71(local_90.field_2._M_allocated_capacity._1_7_,
                               local_90.field_2._M_local_buf[0]) + 1);
    }
    bVar5 = Result::good(__return_storage_ptr__);
    if (bVar5) {
      pcVar3 = (__return_storage_ptr__->m_message)._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)pcVar3 != paVar1) {
        operator_delete(pcVar3,paVar1->_M_allocated_capacity + 1);
      }
      if (this->loopStackDepth == 0) {
        local_90._M_string_length = 0;
        local_90.field_2._M_local_buf[0] = '\0';
        local_70[0] = local_60;
        if (layer->_oneof_case_[0] == 0x26c) {
          plVar6 = (long *)((ulong)(layer->name_).tagged_ptr_.ptr_ & 0xfffffffffffffffe);
          lVar4 = *plVar6;
          local_90._M_dataplus._M_p = (pointer)paVar2;
          std::__cxx11::string::_M_construct<char*>((string *)local_70,lVar4,plVar6[1] + lVar4);
          plVar6 = (long *)std::__cxx11::string::replace((ulong)local_70,0,(char *)0x0,0x3c0f01);
          local_b0 = &local_a0;
          plVar8 = plVar6 + 2;
          if ((long *)*plVar6 == plVar8) {
            local_a0 = *plVar8;
            lStack_98 = plVar6[3];
          }
          else {
            local_a0 = *plVar8;
            local_b0 = (long *)*plVar6;
          }
          local_a8 = plVar6[1];
          *plVar6 = (long)plVar8;
          plVar6[1] = 0;
          *(undefined1 *)(plVar6 + 2) = 0;
          plVar6 = (long *)std::__cxx11::string::append((char *)&local_b0);
        }
        else {
          plVar6 = (long *)((ulong)(layer->name_).tagged_ptr_.ptr_ & 0xfffffffffffffffe);
          lVar4 = *plVar6;
          local_90._M_dataplus._M_p = (pointer)paVar2;
          std::__cxx11::string::_M_construct<char*>((string *)local_70,lVar4,plVar6[1] + lVar4);
          puVar7 = (undefined8 *)
                   std::__cxx11::string::replace((ulong)local_70,0,(char *)0x0,0x3c0f46);
          local_b0 = &local_a0;
          plVar6 = puVar7 + 2;
          if ((long *)*puVar7 == plVar6) {
            local_a0 = *plVar6;
            lStack_98 = puVar7[3];
          }
          else {
            local_a0 = *plVar6;
            local_b0 = (long *)*puVar7;
          }
          local_a8 = puVar7[1];
          *puVar7 = plVar6;
          puVar7[1] = 0;
          *(undefined1 *)(puVar7 + 2) = 0;
          plVar6 = (long *)std::__cxx11::string::append((char *)&local_b0);
        }
        plVar8 = plVar6 + 2;
        if ((long *)*plVar6 == plVar8) {
          local_40 = *plVar8;
          lStack_38 = plVar6[3];
          local_50 = &local_40;
        }
        else {
          local_40 = *plVar8;
          local_50 = (long *)*plVar6;
        }
        local_48 = plVar6[1];
        *plVar6 = (long)plVar8;
        plVar6[1] = 0;
        *(undefined1 *)(plVar6 + 2) = 0;
        std::__cxx11::string::operator=((string *)&local_90,(string *)&local_50);
        if (local_50 != &local_40) {
          operator_delete(local_50,local_40 + 1);
        }
        if (local_b0 != &local_a0) {
          operator_delete(local_b0,local_a0 + 1);
        }
        if (local_70[0] != local_60) {
          operator_delete(local_70[0],local_60[0] + 1);
        }
        Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_90);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_90._M_dataplus._M_p != paVar2) {
          operator_delete(local_90._M_dataplus._M_p,
                          CONCAT71(local_90.field_2._M_allocated_capacity._1_7_,
                                   local_90.field_2._M_local_buf[0]) + 1);
        }
      }
      else {
        Result::Result(__return_storage_ptr__);
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Result NeuralNetworkSpecValidator::validateLoopContinueBreakLayer(const Specification::NeuralNetworkLayer& layer) {
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateInputCount(layer, 0, 0));
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateOutputCount(layer, 0, 0));

    if (loopStackDepth == 0) {
        std::string err;
        if (layer.layer_case() == Specification::NeuralNetworkLayer::LayerCase::kLoopBreak) {
            err = "Loop Break Layer '" + std::string(layer.name()) + "' must be inside the bodyNetwork of a loop layer.";
        } else {
            err = "Loop Continue Layer '" + std::string(layer.name()) + "' must be inside the bodyNetwork of a loop layer.";
        }
        return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
    }

    return Result();
}